

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O2

void __thiscall xray_re::xr_ogf_v4::bone_io::import_ikdata(bone_io *this,xr_reader *r)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  float *pfVar3;
  long lVar4;
  uint32_t *puVar5;
  s_bone_shape *psVar6;
  s_joint_ik_data *psVar7;
  byte bVar8;
  
  bVar8 = 0;
  puVar5 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar5 + 1);
  if (*puVar5 == 1) {
    xr_reader::r_sz(r,&(this->super_xr_bone).m_gamemtl);
    puVar5 = (r->field_2).m_p_u32;
    psVar6 = &(this->super_xr_bone).m_shape;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      uVar1 = *puVar5;
      psVar6->type = (short)uVar1;
      psVar6->flags = (short)(uVar1 >> 0x10);
      puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
      psVar6 = (s_bone_shape *)((long)psVar6 + (ulong)bVar8 * -8 + 4);
    }
    puVar2 = (r->field_2).m_p;
    (r->field_2).m_p_u32 = (uint32_t *)(puVar2 + 0x70);
    puVar5 = (uint32_t *)(puVar2 + 0x70);
    psVar7 = &(this->super_xr_bone).m_joint_ik_data;
    for (lVar4 = 0x13; lVar4 != 0; lVar4 = lVar4 + -1) {
      psVar7->type = *puVar5;
      puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
      psVar7 = (s_joint_ik_data *)((long)psVar7 + (ulong)bVar8 * -8 + 4);
    }
    (r->field_2).m_p = (r->field_2).m_p + 0x4c;
    xr_reader::r_fvector3(r,&(this->super_xr_bone).m_bind_rotate);
    xr_reader::r_fvector3(r,&(this->super_xr_bone).m_bind_offset);
    (this->super_xr_bone).m_bind_length = 0.5;
    pfVar3 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar3 + 1);
    (this->super_xr_bone).m_mass = *pfVar3;
    xr_reader::r_fvector3(r,&(this->super_xr_bone).m_center_of_mass);
    return;
  }
  __assert_fail("version == OGF4_S_JOINT_IK_DATA_VERSION",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                ,0x1c3,"void xray_re::xr_ogf_v4::bone_io::import_ikdata(xr_reader &)");
}

Assistant:

inline void xr_ogf_v4::load_vertices(xr_reader& r)
{
	ogf_vertex_format fmt = static_cast<ogf_vertex_format>(r.r_u32());
	size_t n = r.r_u32();
	m_vb.load_ogf4(r, n, fmt);
	r.debug_find_chunk();
	set_chunk_loaded(OGF4_VERTICES);
}